

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O0

bool __thiscall
cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
          (cmGeneratorExpressionDAGChecker *this,cmGeneratorTarget *tgt,ForGenex genex)

{
  bool bVar1;
  cmGeneratorExpressionDAGChecker *pcVar2;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  bool local_1bc;
  bool local_1bb;
  bool local_1ba;
  bool local_1b9;
  bool result;
  string_view prop;
  cmGeneratorExpressionDAGChecker *top;
  ForGenex genex_local;
  cmGeneratorTarget *tgt_local;
  cmGeneratorExpressionDAGChecker *this_local;
  
  pcVar2 = Top(this);
  __x = (basic_string_view<char,_std::char_traits<char>_>)
        std::__cxx11::string::operator_cast_to_basic_string_view((string *)&pcVar2->Property);
  if (tgt == (cmGeneratorTarget *)0x0) {
    bVar3 = (basic_string_view<char,_std::char_traits<char>_>)
            ::cm::operator____s("LINK_LIBRARIES",0xe);
    bVar1 = std::operator==(__x,bVar3);
    local_1ba = true;
    if (!bVar1) {
      bVar3 = (basic_string_view<char,_std::char_traits<char>_>)
              ::cm::operator____s("INTERFACE_LINK_LIBRARIES",0x18);
      bVar1 = std::operator==(__x,bVar3);
      local_1ba = true;
      if (!bVar1) {
        bVar3 = (basic_string_view<char,_std::char_traits<char>_>)
                ::cm::operator____s("INTERFACE_LINK_LIBRARIES_DIRECT",0x1f);
        bVar1 = std::operator==(__x,bVar3);
        local_1ba = true;
        if (!bVar1) {
          bVar3 = (basic_string_view<char,_std::char_traits<char>_>)
                  ::cm::operator____s("LINK_INTERFACE_LIBRARIES",0x18);
          bVar1 = std::operator==(__x,bVar3);
          local_1ba = true;
          if (!bVar1) {
            bVar3 = (basic_string_view<char,_std::char_traits<char>_>)
                    ::cm::operator____s("IMPORTED_LINK_INTERFACE_LIBRARIES",0x21);
            bVar1 = std::operator==(__x,bVar3);
            local_1ba = true;
            if (!bVar1) {
              bVar1 = cmHasLiteralPrefix<26ul>(__x,(char (*) [26])0xc10ecb);
              local_1ba = true;
              if (!bVar1) {
                local_1ba = cmHasLiteralPrefix<35ul>
                                      (__x,(char (*) [35])"IMPORTED_LINK_INTERFACE_LIBRARIES_");
              }
            }
          }
        }
      }
    }
    if ((genex == LINK_LIBRARY) || (genex == LINK_GROUP)) {
      local_1bb = local_1ba;
    }
    else {
      local_1bc = true;
      if (local_1ba == false) {
        bVar3 = (basic_string_view<char,_std::char_traits<char>_>)
                ::cm::operator____s("INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE",0x27);
        local_1bc = std::operator==(__x,bVar3);
      }
      local_1bb = local_1bc;
    }
    this_local._7_1_ = local_1bb;
  }
  else {
    local_1b9 = false;
    if (pcVar2->Target == tgt) {
      bVar3 = (basic_string_view<char,_std::char_traits<char>_>)
              ::cm::operator____s("LINK_LIBRARIES",0xe);
      local_1b9 = std::operator==(__x,bVar3);
    }
    this_local._7_1_ = local_1b9;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries(
  cmGeneratorTarget const* tgt, ForGenex genex) const
{
  const auto* top = this->Top();

  cm::string_view prop(top->Property);

  if (tgt) {
    return top->Target == tgt && prop == "LINK_LIBRARIES"_s;
  }

  auto result = prop == "LINK_LIBRARIES"_s ||
    prop == "INTERFACE_LINK_LIBRARIES"_s ||
    prop == "INTERFACE_LINK_LIBRARIES_DIRECT"_s ||
    prop == "LINK_INTERFACE_LIBRARIES"_s ||
    prop == "IMPORTED_LINK_INTERFACE_LIBRARIES"_s ||
    cmHasLiteralPrefix(prop, "LINK_INTERFACE_LIBRARIES_") ||
    cmHasLiteralPrefix(prop, "IMPORTED_LINK_INTERFACE_LIBRARIES_");

  return genex == ForGenex::LINK_LIBRARY || genex == ForGenex::LINK_GROUP
    ? result
    : (result || prop == "INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE"_s);
}